

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void luaC_step(lua_State *L)

{
  lu_byte lVar1;
  global_State *g;
  long lVar2;
  l_mem lVar3;
  l_mem lVar4;
  GCObject **ppGVar5;
  l_mem debt;
  l_mem lVar6;
  l_mem addedold1;
  GCObject *local_38;
  
  g = L->l_G;
  if (g->gcstp == 0) {
    lVar1 = g->gckind;
    if (lVar1 != '\x02') {
      if (lVar1 == '\x01') {
        addedold1 = 0;
        lVar2 = g->GCmarked;
        if (g->firstold1 != (GCObject *)0x0) {
          markold(g,g->firstold1,g->reallyold);
          g->firstold1 = (GCObject *)0x0;
        }
        markold(g,g->finobj,g->finobjrold);
        markold(g,g->tobefnz,(GCObject *)0x0);
        atomic(L);
        g->gcstate = '\x03';
        ppGVar5 = sweepgen(L,g,&g->allgc,g->survival,&g->firstold1,&addedold1);
        sweepgen(L,g,ppGVar5,g->old1,&g->firstold1,&addedold1);
        g->reallyold = g->old1;
        g->old1 = *ppGVar5;
        g->survival = g->allgc;
        local_38 = (GCObject *)0x0;
        ppGVar5 = sweepgen(L,g,&g->finobj,g->finobjsur,&local_38,&addedold1);
        sweepgen(L,g,ppGVar5,g->finobjold1,&local_38,&addedold1);
        g->finobjrold = g->finobjold1;
        g->finobjold1 = *ppGVar5;
        g->finobjsur = g->finobj;
        sweepgen(L,g,&g->tobefnz,(GCObject *)0x0,&local_38,&addedold1);
        g->GCmarked = lVar2 + addedold1;
        lVar6 = luaO_applyparam(g->gcparams[2],g->GCmajorminor);
        if ((lVar6 == 0) || (g->GCmarked < lVar6)) {
          finishgencycle(L,g);
        }
        else {
          minor2inc(L,g,'\x02');
          g->GCmarked = 0;
        }
        setminordebt(g);
        return;
      }
      if (lVar1 != '\0') {
        return;
      }
    }
    debt = luaO_applyparam(g->gcparams[5],100);
    lVar3 = luaO_applyparam(g->gcparams[4],debt / 8);
    lVar6 = lVar3;
    while (lVar4 = singlestep(L,(uint)(lVar3 == 0)), lVar4 != -3) {
      if (lVar4 == -1) {
        return;
      }
      if ((lVar3 != 0 && lVar4 == -2) || (lVar6 = lVar6 - lVar4, lVar6 < 1 && lVar3 != 0)) break;
    }
    if (g->gcstate == '\b') {
      setpause(g);
      return;
    }
  }
  else {
    if ((g->gcstp & 1) == 0) {
      return;
    }
    debt = 20000;
  }
  luaE_setdebt(g,debt);
  return;
}

Assistant:

void luaC_step (lua_State *L) {
  global_State *g = G(L);
  lua_assert(!g->gcemergency);
  if (!gcrunning(g)) {  /* not running? */
    if (g->gcstp & GCSTPUSR)  /* stopped by the user? */
      luaE_setdebt(g, 20000);
  }
  else {
    luai_tracegc(L, 1);  /* for internal debugging */
    switch (g->gckind) {
      case KGC_INC: case KGC_GENMAJOR:
        incstep(L, g);
        break;
      case KGC_GENMINOR:
        youngcollection(L, g);
        setminordebt(g);
        break;
    }
    luai_tracegc(L, 0);  /* for internal debugging */
  }
}